

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall
PruneReplayer::access_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info)

{
  Hash hash_00;
  bool bVar1;
  size_type sVar2;
  VkPipelineLibraryCreateInfoKHR *pVVar3;
  pointer ppVar4;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
  local_90;
  VkPipeline local_88;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
  local_80;
  iterator lib_itr;
  uint32_t i;
  VkPipelineLibraryCreateInfoKHR *library_info;
  VkShaderModule local_58;
  uint local_4c;
  _Node_iterator_base<unsigned_long,_false> _Stack_48;
  uint32_t stage;
  undefined1 local_40;
  VkRenderPass local_38;
  _Node_iterator_base<unsigned_long,_false> local_30;
  undefined1 local_28;
  VkGraphicsPipelineCreateInfo *local_20;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Hash hash_local;
  PruneReplayer *this_local;
  
  local_20 = create_info;
  create_info_local = (VkGraphicsPipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  sVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::count(&this->accessed_graphics_pipelines,(key_type *)&create_info_local);
  if (sVar2 == 0) {
    pVar5 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert(&this->accessed_graphics_pipelines,(value_type *)&create_info_local);
    local_30._M_cur =
         (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    local_28 = pVar5.second;
    access_pipeline_layout(this,(Hash)local_20->layout);
    if (local_20->renderPass != (VkRenderPass)0x0) {
      local_38 = local_20->renderPass;
      pVar5 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert(&this->accessed_render_passes,(value_type *)&local_38);
      _Stack_48._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      local_40 = pVar5.second;
    }
    for (local_4c = 0; local_4c < local_20->stageCount; local_4c = local_4c + 1) {
      local_58 = local_20->pStages[local_4c].module;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert(&this->accessed_shader_modules,(value_type *)&local_58);
    }
    pVVar3 = find_pnext<VkPipelineLibraryCreateInfoKHR>
                       (VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,local_20->pNext);
    if (pVVar3 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      for (lib_itr.
           super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
           ._M_cur._4_4_ = 0;
          lib_itr.
          super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
          ._M_cur._4_4_ < pVVar3->libraryCount;
          lib_itr.
          super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
          ._M_cur._4_4_ =
               lib_itr.
               super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
               ._M_cur._4_4_ + 1) {
        local_88 = pVVar3->pLibraries
                   [lib_itr.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                    ._M_cur._4_4_];
        local_80._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
             ::find(&this->library_graphics_pipelines,(key_type *)&local_88);
        local_90._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
             ::end(&this->library_graphics_pipelines);
        bVar1 = std::__detail::operator!=(&local_80,&local_90);
        if (bVar1) {
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                                 *)&local_80);
          hash_00 = ppVar4->first;
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                                 *)&local_80);
          access_graphics_pipeline(this,hash_00,ppVar4->second);
        }
      }
    }
  }
  return;
}

Assistant:

void access_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info)
	{
		if (accessed_graphics_pipelines.count(hash))
			return;
		accessed_graphics_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		if (create_info->renderPass != VK_NULL_HANDLE)
			accessed_render_passes.insert((Hash) create_info->renderPass);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		auto *library_info =
				find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
				                                           create_info->pNext);

		if (library_info)
		{
			for (uint32_t i = 0; i < library_info->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_graphics_pipelines.find((Hash) library_info->pLibraries[i]);
				if (lib_itr != library_graphics_pipelines.end())
					access_graphics_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}